

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Human.cpp
# Opt level: O0

Human * __thiscall Human::Last_Name_Getter_abi_cxx11_(Human *this)

{
  long in_RSI;
  Human *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)(in_RSI + 0x40));
  return this;
}

Assistant:

string Human ::Last_Name_Getter(){
    return Last_Name;
}